

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::storeResultPixels
          (SRGBTestCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *resultPixelData)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  pointer pTVar2;
  long lVar3;
  long lVar4;
  allocator<char> local_399;
  long local_398;
  vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *local_390;
  TestLog *local_388;
  long local_380;
  undefined1 local_378 [64];
  Vector<float,_4> local_338;
  ostringstream message;
  MessageBuilder local_1b0;
  
  pTVar1 = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  local_390 = (vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)resultPixelData;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  local_388 = pTVar1;
  (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  lVar3 = 0;
  local_398 = 0;
  lVar4 = 0;
  while( true ) {
    pTVar2 = (this->m_textureResultList).
             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_textureResultList).
                     super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x28) <= lVar4)
    break;
    local_380 = lVar3;
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&local_1b0,
               (TextureLevel *)((long)(pTVar2->m_size).m_data + lVar3 + -8));
    tcu::ConstPixelBufferAccess::getPixel
              ((ConstPixelBufferAccess *)local_378,(int)&local_1b0,this->m_px,this->m_py);
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>(local_390,(Vector<float,_4> *)local_378);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Result color: ",(allocator<char> *)local_378);
    lVar3 = local_398;
    tcu::Vector<float,_4>::Vector(&local_338,(Vector<float,_4> *)(*(long *)local_390 + local_398));
    logColor(this,(string *)&local_1b0,(int)lVar4,&local_338);
    std::__cxx11::string::~string((string *)&local_1b0);
    lVar4 = lVar4 + 1;
    local_398 = lVar3 + 0x10;
    lVar3 = local_380 + 0x28;
  }
  tcu::operator<<((ostream *)&message,&this->m_epsilonError);
  this_00 = &local_1b0.m_str;
  local_1b0.m_log = local_388;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_378,"Epsilon error: ",&local_399);
  std::operator<<((ostream *)this_00,(string *)local_378);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,(string *)(local_378 + 0x20));
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)(local_378 + 0x20));
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
  return;
}

Assistant:

void SRGBTestCase::storeResultPixels (std::vector<tcu::Vec4>& resultPixelData)
{
	tcu::TestLog&		log			= m_context.getTestContext().getLog();
	std::ostringstream	message;
	int					width		= m_context.getRenderContext().getRenderTarget().getWidth();
	int					height		= m_context.getRenderContext().getRenderTarget().getHeight();

	// ensure result sampling coordinates are within range of the result color attachment
	DE_ASSERT((m_px >= 0) && (m_px < width));
	DE_ASSERT((m_py >= 0) && (m_py < height));
	DE_UNREF(width && height);

	for (int idx = 0; idx < (int)m_textureResultList.size(); idx++)
	{
		resultPixelData.push_back(m_textureResultList[idx].getAccess().getPixel(m_px, m_py));
		this->logColor(std::string("Result color: "), idx, resultPixelData[idx]);
	}

	// log error rate (threshold)
	message << m_epsilonError;
	log << tcu::TestLog::Message << std::string("Epsilon error: ") << message.str() << tcu::TestLog::EndMessage;
}